

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_iterator.hpp
# Opt level: O0

bool __thiscall
boost::algorithm::
split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::equal(split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *Other)

{
  bool bVar1;
  bool bVar2;
  split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  bool bOtherEof;
  bool bEof;
  uint6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  
  bVar1 = eof(in_RDI);
  bVar2 = eof(in_RDI);
  if ((bVar1) || (bVar2)) {
    bVar1 = bVar1 == bVar2;
  }
  else {
    bVar2 = boost::operator==((iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_RDI,
                              (iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffdf,
                                          CONCAT16(in_stack_ffffffffffffffde,
                                                   in_stack_ffffffffffffffd8)));
    bVar1 = false;
    if (bVar2) {
      bVar2 = __gnu_cxx::operator==
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_RDI,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffffdf,(uint7)in_stack_ffffffffffffffd8));
      bVar1 = false;
      if (bVar2) {
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_RDI,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT17(in_stack_ffffffffffffffdf,(uint7)in_stack_ffffffffffffffd8));
      }
    }
  }
  return bVar1;
}

Assistant:

bool equal( const split_iterator& Other ) const
            {
                bool bEof=eof();
                bool bOtherEof=Other.eof();

                return bEof || bOtherEof ? bEof==bOtherEof :
                    (
                        m_Match==Other.m_Match &&
                        m_Next==Other.m_Next &&
                        m_End==Other.m_End
                    );
            }